

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O0

void __thiscall sf::Window::display(Window *this)

{
  bool bVar1;
  Time TVar2;
  Time in_RDI;
  Time in_stack_ffffffffffffffb8;
  Time in_stack_ffffffffffffffc8;
  Clock *this_00;
  
  bVar1 = setActive((Window *)in_stack_ffffffffffffffc8.m_microseconds,
                    SUB81((ulong)in_RDI.m_microseconds >> 0x38,0));
  if (bVar1) {
    (**(code **)(**(long **)(in_RDI.m_microseconds + 0x18) + 0x10))();
  }
  bVar1 = sf::operator!=(in_RDI,in_stack_ffffffffffffffb8);
  if (bVar1) {
    this_00 = *(Clock **)(in_RDI.m_microseconds + 0x28);
    Clock::getElapsedTime((Clock *)in_stack_ffffffffffffffc8.m_microseconds);
    TVar2 = sf::operator-(in_stack_ffffffffffffffc8,in_RDI);
    sleep((uint)TVar2.m_microseconds);
    Clock::restart(this_00);
  }
  return;
}

Assistant:

void Window::display()
{
    // Display the backbuffer on screen
    if (setActive())
        m_context->display();

    // Limit the framerate if needed
    if (m_frameTimeLimit != Time::Zero)
    {
        sleep(m_frameTimeLimit - m_clock.getElapsedTime());
        m_clock.restart();
    }
}